

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleInstallMode(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  cmake *this_00;
  cmInstalledFile *file;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  ostringstream e;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  p_Var2 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var2 == p_Var1) {
LAB_002044ff:
      return (_Rb_tree_header *)p_Var2 == p_Var1;
    }
    file = cmake::GetOrCreateInstalledFile
                     (this_00,(this->super_cmCommand).Makefile,(string *)(p_Var2 + 1));
    if (file == (cmInstalledFile *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = std::operator<<((ostream *)local_1a0,
                               "given INSTALL name that could not be found or created: ");
      std::operator<<(poVar3,(string *)(p_Var2 + 1));
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      goto LAB_002044ff;
    }
    HandleInstall(this,file);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

bool cmSetPropertyCommand::HandleInstallMode()
{
  cmake* cm = this->Makefile->GetCMakeInstance();

  for (std::string const& name : this->Names) {
    if (cmInstalledFile* file =
          cm->GetOrCreateInstalledFile(this->Makefile, name)) {
      if (!this->HandleInstall(file)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "given INSTALL name that could not be found or created: " << name;
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}